

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMatrixAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_3::TypedAttribute<Imath_3_1::Matrix33<float>_>::readValueFrom
          (TypedAttribute<Imath_3_1::Matrix33<float>_> *this,IStream *is,int size,int version)

{
  IStream *in_RSI;
  long in_RDI;
  IStream *v;
  IStream *in_stack_ffffffffffffffa0;
  
  v = in_RSI;
  Imath_3_1::Matrix33<float>::operator[]((Matrix33<float> *)(in_RDI + 8),0);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_stack_ffffffffffffffa0,(float *)v);
  Imath_3_1::Matrix33<float>::operator[]((Matrix33<float> *)(in_RDI + 8),0);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,(float *)v);
  Imath_3_1::Matrix33<float>::operator[]((Matrix33<float> *)(in_RDI + 8),0);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,(float *)v);
  Imath_3_1::Matrix33<float>::operator[]((Matrix33<float> *)(in_RDI + 8),1);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,(float *)v);
  Imath_3_1::Matrix33<float>::operator[]((Matrix33<float> *)(in_RDI + 8),1);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,(float *)v);
  Imath_3_1::Matrix33<float>::operator[]((Matrix33<float> *)(in_RDI + 8),1);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,(float *)v);
  Imath_3_1::Matrix33<float>::operator[]((Matrix33<float> *)(in_RDI + 8),2);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,(float *)v);
  Imath_3_1::Matrix33<float>::operator[]((Matrix33<float> *)(in_RDI + 8),2);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,(float *)v);
  Imath_3_1::Matrix33<float>::operator[]((Matrix33<float> *)(in_RDI + 8),2);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,(float *)v);
  return;
}

Assistant:

IMF_EXPORT void
M33fAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    Xdr::read<StreamIO> (is, _value[0][0]);
    Xdr::read<StreamIO> (is, _value[0][1]);
    Xdr::read<StreamIO> (is, _value[0][2]);

    Xdr::read<StreamIO> (is, _value[1][0]);
    Xdr::read<StreamIO> (is, _value[1][1]);
    Xdr::read<StreamIO> (is, _value[1][2]);

    Xdr::read<StreamIO> (is, _value[2][0]);
    Xdr::read<StreamIO> (is, _value[2][1]);
    Xdr::read<StreamIO> (is, _value[2][2]);
}